

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void cmGlobalGhsMultiGenerator::GetDocumentation(cmDocumentationEntry *entry)

{
  string local_30 [32];
  cmDocumentationEntry *local_10;
  cmDocumentationEntry *entry_local;
  
  local_10 = entry;
  GetActualName_abi_cxx11_();
  std::__cxx11::string::operator=((string *)local_10,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::operator=
            ((string *)&local_10->Brief,
             "Generates Green Hills MULTI files (experimental, work-in-progress).");
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::GetDocumentation(cmDocumentationEntry& entry)
{
  entry.Name = GetActualName();
  entry.Brief =
    "Generates Green Hills MULTI files (experimental, work-in-progress).";
}